

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_sse2_intrinsics.c
# Opt level: O1

void png_read_filter_row_paeth3_sse2(png_row_infop row_info,png_bytep row,png_const_bytep prev)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined3 uVar5;
  undefined3 uVar6;
  undefined7 uVar7;
  undefined3 uVar8;
  uint7 uVar9;
  ulong uVar10;
  char cVar11;
  char cVar15;
  char cVar16;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  byte bVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar17 [16];
  short sVar22;
  undefined1 auVar23 [16];
  ushort uVar24;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  undefined1 auVar25 [16];
  short sVar33;
  ushort uVar34;
  short sVar35;
  undefined1 auVar36 [14];
  short sVar39;
  ushort uVar40;
  short sVar41;
  ushort uVar42;
  short sVar43;
  ushort uVar44;
  short sVar45;
  ushort uVar46;
  short sVar47;
  ushort uVar48;
  short sVar49;
  ushort uVar50;
  short sVar51;
  ushort uVar52;
  undefined1 auVar37 [16];
  short sVar53;
  ushort uVar54;
  short sVar55;
  ushort uVar56;
  short sVar57;
  ushort uVar58;
  short sVar59;
  ushort uVar60;
  short sVar61;
  ushort uVar62;
  short sVar63;
  ushort uVar64;
  short sVar65;
  ushort uVar66;
  short sVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  undefined4 uVar12;
  undefined1 auVar38 [16];
  
  uVar10 = row_info->rowbytes;
  auVar13 = (undefined1  [16])0x0;
  if (uVar10 < 4) {
    auVar17 = (undefined1  [16])0x0;
  }
  else {
    auVar14 = (undefined1  [16])0x0;
    do {
      uVar12 = *(undefined4 *)prev;
      bVar18 = (byte)((uint)uVar12 >> 0x18);
      uVar7 = CONCAT25((short)(((uint7)bVar18 << 0x30) >> 0x28),
                       CONCAT14((char)((uint)uVar12 >> 0x10),uVar12));
      uVar9 = (uint7)CONCAT41((int)(CONCAT34((int3)((uint7)uVar7 >> 0x20),uVar12) >> 0x18),
                              (char)((uint)uVar12 >> 8)) & 0xffffff00ff;
      auVar17 = ZEXT716(CONCAT52((int5)uVar9,(ushort)(byte)uVar12));
      uVar1 = *(undefined4 *)row;
      sVar33 = (ushort)(byte)uVar12 - auVar14._0_2_;
      sVar39 = (short)uVar9 - auVar14._2_2_;
      sVar41 = (short)((uint7)uVar7 >> 0x20) - auVar14._4_2_;
      sVar43 = (ushort)bVar18 - auVar14._6_2_;
      sVar20 = auVar14._8_2_;
      sVar45 = -sVar20;
      sVar21 = auVar14._10_2_;
      sVar47 = -sVar21;
      sVar22 = auVar14._12_2_;
      sVar49 = -sVar22;
      sVar35 = auVar14._14_2_;
      sVar51 = -sVar35;
      sVar53 = auVar13._0_2_ - auVar14._0_2_;
      sVar55 = auVar13._2_2_ - auVar14._2_2_;
      sVar57 = auVar13._4_2_ - auVar14._4_2_;
      sVar59 = auVar13._6_2_ - auVar14._6_2_;
      sVar61 = auVar13._8_2_ - sVar20;
      sVar63 = auVar13._10_2_ - sVar21;
      sVar65 = auVar13._12_2_ - sVar22;
      sVar67 = auVar13._14_2_ - sVar35;
      sVar2 = -sVar33;
      sVar3 = -sVar39;
      sVar4 = -sVar41;
      sVar19 = -sVar43;
      uVar24 = (ushort)(sVar2 < sVar33) * sVar33 | (ushort)(sVar2 >= sVar33) * sVar2;
      uVar26 = (ushort)(sVar3 < sVar39) * sVar39 | (ushort)(sVar3 >= sVar39) * sVar3;
      uVar27 = (ushort)(sVar4 < sVar41) * sVar41 | (ushort)(sVar4 >= sVar41) * sVar4;
      uVar28 = (ushort)(sVar19 < sVar43) * sVar43 | (ushort)(sVar19 >= sVar43) * sVar19;
      uVar29 = (ushort)(sVar20 < sVar45) * sVar45 | (ushort)(sVar20 >= sVar45) * sVar20;
      uVar30 = (ushort)(sVar21 < sVar47) * sVar47 | (ushort)(sVar21 >= sVar47) * sVar21;
      uVar31 = (ushort)(sVar22 < sVar49) * sVar49 | (ushort)(sVar22 >= sVar49) * sVar22;
      uVar32 = (ushort)(sVar35 < sVar51) * sVar51 | (ushort)(sVar35 >= sVar51) * sVar35;
      sVar33 = sVar33 + sVar53;
      sVar39 = sVar39 + sVar55;
      sVar41 = sVar41 + sVar57;
      sVar43 = sVar43 + sVar59;
      sVar45 = sVar45 + sVar61;
      sVar47 = sVar47 + sVar63;
      sVar49 = sVar49 + sVar65;
      sVar51 = sVar51 + sVar67;
      sVar2 = -sVar53;
      sVar3 = -sVar55;
      sVar4 = -sVar57;
      sVar19 = -sVar59;
      sVar20 = -sVar61;
      sVar21 = -sVar63;
      sVar22 = -sVar65;
      sVar35 = -sVar67;
      uVar69 = (ushort)(sVar2 < sVar53) * sVar53 | (ushort)(sVar2 >= sVar53) * sVar2;
      uVar70 = (ushort)(sVar3 < sVar55) * sVar55 | (ushort)(sVar3 >= sVar55) * sVar3;
      uVar71 = (ushort)(sVar4 < sVar57) * sVar57 | (ushort)(sVar4 >= sVar57) * sVar4;
      uVar72 = (ushort)(sVar19 < sVar59) * sVar59 | (ushort)(sVar19 >= sVar59) * sVar19;
      uVar73 = (ushort)(sVar20 < sVar61) * sVar61 | (ushort)(sVar20 >= sVar61) * sVar20;
      uVar74 = (ushort)(sVar21 < sVar63) * sVar63 | (ushort)(sVar21 >= sVar63) * sVar21;
      uVar75 = (ushort)(sVar22 < sVar65) * sVar65 | (ushort)(sVar22 >= sVar65) * sVar22;
      uVar76 = (ushort)(sVar35 < sVar67) * sVar67 | (ushort)(sVar35 >= sVar67) * sVar35;
      sVar2 = -sVar33;
      sVar3 = -sVar39;
      sVar4 = -sVar41;
      sVar19 = -sVar43;
      sVar20 = -sVar45;
      sVar21 = -sVar47;
      sVar22 = -sVar49;
      sVar35 = -sVar51;
      uVar54 = (ushort)(sVar2 < sVar33) * sVar33 | (ushort)(sVar2 >= sVar33) * sVar2;
      uVar56 = (ushort)(sVar3 < sVar39) * sVar39 | (ushort)(sVar3 >= sVar39) * sVar3;
      uVar58 = (ushort)(sVar4 < sVar41) * sVar41 | (ushort)(sVar4 >= sVar41) * sVar4;
      uVar60 = (ushort)(sVar19 < sVar43) * sVar43 | (ushort)(sVar19 >= sVar43) * sVar19;
      uVar62 = (ushort)(sVar20 < sVar45) * sVar45 | (ushort)(sVar20 >= sVar45) * sVar20;
      uVar64 = (ushort)(sVar21 < sVar47) * sVar47 | (ushort)(sVar21 >= sVar47) * sVar21;
      uVar66 = (ushort)(sVar22 < sVar49) * sVar49 | (ushort)(sVar22 >= sVar49) * sVar22;
      uVar68 = (ushort)(sVar35 < sVar51) * sVar51 | (ushort)(sVar35 >= sVar51) * sVar35;
      uVar34 = ((short)uVar69 < (short)uVar24) * uVar69 | ((short)uVar69 >= (short)uVar24) * uVar24;
      uVar40 = ((short)uVar70 < (short)uVar26) * uVar70 | ((short)uVar70 >= (short)uVar26) * uVar26;
      uVar42 = ((short)uVar71 < (short)uVar27) * uVar71 | ((short)uVar71 >= (short)uVar27) * uVar27;
      uVar44 = ((short)uVar72 < (short)uVar28) * uVar72 | ((short)uVar72 >= (short)uVar28) * uVar28;
      uVar46 = ((short)uVar73 < (short)uVar29) * uVar73 | ((short)uVar73 >= (short)uVar29) * uVar29;
      uVar48 = ((short)uVar74 < (short)uVar30) * uVar74 | ((short)uVar74 >= (short)uVar30) * uVar30;
      uVar50 = ((short)uVar75 < (short)uVar31) * uVar75 | ((short)uVar75 >= (short)uVar31) * uVar31;
      uVar52 = ((short)uVar76 < (short)uVar32) * uVar76 | ((short)uVar76 >= (short)uVar32) * uVar32;
      uVar34 = ((short)uVar54 < (short)uVar34) * uVar54 | ((short)uVar54 >= (short)uVar34) * uVar34;
      uVar40 = ((short)uVar56 < (short)uVar40) * uVar56 | ((short)uVar56 >= (short)uVar40) * uVar40;
      uVar42 = ((short)uVar58 < (short)uVar42) * uVar58 | ((short)uVar58 >= (short)uVar42) * uVar42;
      uVar44 = ((short)uVar60 < (short)uVar44) * uVar60 | ((short)uVar60 >= (short)uVar44) * uVar44;
      uVar46 = ((short)uVar62 < (short)uVar46) * uVar62 | ((short)uVar62 >= (short)uVar46) * uVar46;
      uVar48 = ((short)uVar64 < (short)uVar48) * uVar64 | ((short)uVar64 >= (short)uVar48) * uVar48;
      uVar50 = ((short)uVar66 < (short)uVar50) * uVar66 | ((short)uVar66 >= (short)uVar50) * uVar50;
      uVar52 = ((short)uVar68 < (short)uVar52) * uVar68 | ((short)uVar68 >= (short)uVar52) * uVar52;
      auVar25._0_2_ = -(ushort)(uVar24 == uVar34);
      auVar25._2_2_ = -(ushort)(uVar26 == uVar40);
      auVar25._4_2_ = -(ushort)(uVar27 == uVar42);
      auVar25._6_2_ = -(ushort)(uVar28 == uVar44);
      auVar25._8_2_ = -(ushort)(uVar29 == uVar46);
      auVar25._10_2_ = -(ushort)(uVar30 == uVar48);
      auVar25._12_2_ = -(ushort)(uVar31 == uVar50);
      auVar25._14_2_ = -(ushort)(uVar32 == uVar52);
      auVar37._0_2_ = -(ushort)(uVar34 == uVar69);
      auVar37._2_2_ = -(ushort)(uVar40 == uVar70);
      auVar37._4_2_ = -(ushort)(uVar42 == uVar71);
      auVar37._6_2_ = -(ushort)(uVar44 == uVar72);
      auVar37._8_2_ = -(ushort)(uVar46 == uVar73);
      auVar37._10_2_ = -(ushort)(uVar48 == uVar74);
      auVar37._12_2_ = -(ushort)(uVar50 == uVar75);
      auVar37._14_2_ = -(ushort)(uVar52 == uVar76);
      auVar14 = auVar13 & auVar25 | ~auVar25 & (~auVar37 & auVar14 | auVar17 & auVar37);
      cVar11 = auVar14[0] + (char)uVar1;
      sVar49 = CONCAT11(auVar14[1],cVar11);
      cVar15 = auVar14[2] + (char)((uint)uVar1 >> 8);
      uVar12 = CONCAT13(auVar14[3],CONCAT12(cVar15,sVar49));
      cVar16 = auVar14[4] + (char)((uint)uVar1 >> 0x10);
      auVar13._0_6_ = CONCAT15(auVar14[5],CONCAT14(cVar16,uVar12));
      auVar13[6] = auVar14[6] + (char)((uint)uVar1 >> 0x18);
      auVar13[7] = auVar14[7];
      auVar13[8] = auVar14[8];
      auVar13[9] = auVar14[9];
      auVar13[10] = auVar14[10];
      auVar13[0xb] = auVar14[0xb];
      auVar13[0xc] = auVar14[0xc];
      auVar13[0xd] = auVar14[0xd];
      auVar13[0xe] = auVar14[0xe];
      auVar13[0xf] = auVar14[0xf];
      sVar45 = (short)((uint)uVar12 >> 0x10);
      sVar47 = (short)((uint6)auVar13._0_6_ >> 0x20);
      *(ushort *)row =
           CONCAT11((0 < sVar45) * (sVar45 < 0x100) * cVar15 - (0xff < sVar45),
                    (0 < sVar49) * (sVar49 < 0x100) * cVar11 - (0xff < sVar49));
      row[2] = (0 < sVar47) * (sVar47 < 0x100) * cVar16 - (0xff < sVar47);
      prev = prev + 3;
      row = row + 3;
      uVar10 = uVar10 - 3;
      auVar14 = auVar17;
    } while (3 < uVar10);
  }
  if (uVar10 != 0) {
    uVar5 = *(undefined3 *)prev;
    bVar18 = (byte)((uint3)uVar5 >> 0x10);
    uVar8 = CONCAT21((short)(((uint5)bVar18 << 0x20) >> 0x18),(char)((uint3)uVar5 >> 8));
    uVar6 = *(undefined3 *)row;
    sVar35 = (ushort)(byte)uVar5 - auVar17._0_2_;
    sVar33 = (short)uVar8 - auVar17._2_2_;
    sVar39 = (ushort)bVar18 - auVar17._4_2_;
    sVar19 = auVar17._8_2_;
    sVar45 = -sVar19;
    sVar20 = auVar17._10_2_;
    sVar47 = -sVar20;
    sVar21 = auVar17._12_2_;
    sVar49 = -sVar21;
    sVar22 = auVar17._14_2_;
    sVar51 = -sVar22;
    sVar41 = auVar13._0_2_ - auVar17._0_2_;
    sVar43 = auVar13._2_2_ - auVar17._2_2_;
    sVar53 = auVar13._4_2_ - auVar17._4_2_;
    sVar55 = auVar13._8_2_ - sVar19;
    sVar57 = auVar13._10_2_ - sVar20;
    sVar59 = auVar13._12_2_ - sVar21;
    sVar61 = auVar13._14_2_ - sVar22;
    sVar2 = -sVar35;
    sVar3 = -sVar33;
    sVar4 = -sVar39;
    uVar24 = (ushort)(sVar2 < sVar35) * sVar35 | (ushort)(sVar2 >= sVar35) * sVar2;
    uVar26 = (ushort)(sVar3 < sVar33) * sVar33 | (ushort)(sVar3 >= sVar33) * sVar3;
    uVar27 = (ushort)(sVar4 < sVar39) * sVar39 | (ushort)(sVar4 >= sVar39) * sVar4;
    uVar28 = (ushort)(sVar19 < sVar45) * sVar45 | (ushort)(sVar19 >= sVar45) * sVar19;
    uVar29 = (ushort)(sVar20 < sVar47) * sVar47 | (ushort)(sVar20 >= sVar47) * sVar20;
    uVar30 = (ushort)(sVar21 < sVar49) * sVar49 | (ushort)(sVar21 >= sVar49) * sVar21;
    uVar31 = (ushort)(sVar22 < sVar51) * sVar51 | (ushort)(sVar22 >= sVar51) * sVar22;
    sVar35 = sVar35 + sVar41;
    sVar33 = sVar33 + sVar43;
    sVar39 = sVar39 + sVar53;
    sVar45 = sVar45 + sVar55;
    sVar47 = sVar47 + sVar57;
    sVar49 = sVar49 + sVar59;
    sVar51 = sVar51 + sVar61;
    sVar2 = -sVar41;
    sVar3 = -sVar43;
    sVar4 = -sVar53;
    sVar19 = -sVar55;
    sVar20 = -sVar57;
    sVar21 = -sVar59;
    sVar22 = -sVar61;
    uVar64 = (ushort)(sVar2 < sVar41) * sVar41 | (ushort)(sVar2 >= sVar41) * sVar2;
    uVar66 = (ushort)(sVar3 < sVar43) * sVar43 | (ushort)(sVar3 >= sVar43) * sVar3;
    uVar68 = (ushort)(sVar4 < sVar53) * sVar53 | (ushort)(sVar4 >= sVar53) * sVar4;
    uVar69 = (ushort)(sVar19 < sVar55) * sVar55 | (ushort)(sVar19 >= sVar55) * sVar19;
    uVar70 = (ushort)(sVar20 < sVar57) * sVar57 | (ushort)(sVar20 >= sVar57) * sVar20;
    uVar71 = (ushort)(sVar21 < sVar59) * sVar59 | (ushort)(sVar21 >= sVar59) * sVar21;
    uVar72 = (ushort)(sVar22 < sVar61) * sVar61 | (ushort)(sVar22 >= sVar61) * sVar22;
    sVar2 = -sVar35;
    sVar3 = -sVar33;
    sVar4 = -sVar39;
    sVar19 = -sVar45;
    sVar20 = -sVar47;
    sVar21 = -sVar49;
    sVar22 = -sVar51;
    uVar32 = (ushort)(sVar2 < sVar35) * sVar35 | (ushort)(sVar2 >= sVar35) * sVar2;
    uVar34 = (ushort)(sVar3 < sVar33) * sVar33 | (ushort)(sVar3 >= sVar33) * sVar3;
    uVar40 = (ushort)(sVar4 < sVar39) * sVar39 | (ushort)(sVar4 >= sVar39) * sVar4;
    uVar42 = (ushort)(sVar19 < sVar45) * sVar45 | (ushort)(sVar19 >= sVar45) * sVar19;
    uVar44 = (ushort)(sVar20 < sVar47) * sVar47 | (ushort)(sVar20 >= sVar47) * sVar20;
    uVar46 = (ushort)(sVar21 < sVar49) * sVar49 | (ushort)(sVar21 >= sVar49) * sVar21;
    uVar48 = (ushort)(sVar22 < sVar51) * sVar51 | (ushort)(sVar22 >= sVar51) * sVar22;
    uVar50 = ((short)uVar64 < (short)uVar24) * uVar64 | ((short)uVar64 >= (short)uVar24) * uVar24;
    uVar52 = ((short)uVar66 < (short)uVar26) * uVar66 | ((short)uVar66 >= (short)uVar26) * uVar26;
    uVar54 = ((short)uVar68 < (short)uVar27) * uVar68 | ((short)uVar68 >= (short)uVar27) * uVar27;
    uVar56 = ((short)uVar69 < (short)uVar28) * uVar69 | ((short)uVar69 >= (short)uVar28) * uVar28;
    uVar58 = ((short)uVar70 < (short)uVar29) * uVar70 | ((short)uVar70 >= (short)uVar29) * uVar29;
    uVar60 = ((short)uVar71 < (short)uVar30) * uVar71 | ((short)uVar71 >= (short)uVar30) * uVar30;
    uVar62 = ((short)uVar72 < (short)uVar31) * uVar72 | ((short)uVar72 >= (short)uVar31) * uVar31;
    uVar32 = ((short)uVar32 < (short)uVar50) * uVar32 | ((short)uVar32 >= (short)uVar50) * uVar50;
    uVar34 = ((short)uVar34 < (short)uVar52) * uVar34 | ((short)uVar34 >= (short)uVar52) * uVar52;
    uVar40 = ((short)uVar40 < (short)uVar54) * uVar40 | ((short)uVar40 >= (short)uVar54) * uVar54;
    uVar42 = ((short)uVar42 < (short)uVar56) * uVar42 | ((short)uVar42 >= (short)uVar56) * uVar56;
    uVar44 = ((short)uVar44 < (short)uVar58) * uVar44 | ((short)uVar44 >= (short)uVar58) * uVar58;
    uVar46 = ((short)uVar46 < (short)uVar60) * uVar46 | ((short)uVar46 >= (short)uVar60) * uVar60;
    uVar48 = ((short)uVar48 < (short)uVar62) * uVar48 | ((short)uVar48 >= (short)uVar62) * uVar62;
    auVar23._0_2_ = -(ushort)(uVar24 == uVar32);
    auVar23._2_2_ = -(ushort)(uVar26 == uVar34);
    auVar23._4_2_ = -(ushort)(uVar27 == uVar40);
    auVar23._6_2_ = 0;
    auVar23._8_2_ = -(ushort)(uVar28 == uVar42);
    auVar23._10_2_ = -(ushort)(uVar29 == uVar44);
    auVar23._12_2_ = -(ushort)(uVar30 == uVar46);
    auVar23._14_2_ = -(ushort)(uVar31 == uVar48);
    auVar36._0_2_ = -(ushort)(uVar32 == uVar64);
    auVar36._2_2_ = -(ushort)(uVar34 == uVar66);
    auVar36._4_2_ = -(ushort)(uVar40 == uVar68);
    auVar36._6_2_ = 0;
    auVar36._8_2_ = -(ushort)(uVar42 == uVar69);
    auVar36._10_2_ = -(ushort)(uVar44 == uVar70);
    auVar36._12_2_ = -(ushort)(uVar46 == uVar71);
    auVar38._14_2_ = -(ushort)(uVar48 == uVar72);
    auVar38._0_14_ = auVar36;
    auVar14._14_2_ = 0;
    auVar14._0_14_ = auVar36;
    auVar13 = ~auVar23 &
              (~auVar38 & auVar17 | ZEXT516(CONCAT32(uVar8,(ushort)(byte)uVar5)) & auVar14) |
              auVar13 & auVar23;
    cVar11 = auVar13[0] + (char)uVar6;
    sVar49 = CONCAT11(auVar13[1],cVar11);
    cVar15 = auVar13[2] + (char)((uint3)uVar6 >> 8);
    uVar12 = CONCAT13(auVar13[3],CONCAT12(cVar15,sVar49));
    cVar16 = auVar13[4] + (char)((uint3)uVar6 >> 0x10);
    sVar45 = (short)((uint)uVar12 >> 0x10);
    sVar47 = (short)(CONCAT15(auVar13[5],CONCAT14(cVar16,uVar12)) >> 0x20);
    *(ushort *)row =
         CONCAT11((0 < sVar45) * (sVar45 < 0x100) * cVar15 - (0xff < sVar45),
                  (0 < sVar49) * (sVar49 < 0x100) * cVar11 - (0xff < sVar49));
    row[2] = (0 < sVar47) * (sVar47 < 0x100) * cVar16 - (0xff < sVar47);
  }
  return;
}

Assistant:

void png_read_filter_row_paeth3_sse2(png_row_infop row_info, png_bytep row,
   png_const_bytep prev)
{
   /* Paeth tries to predict pixel d using the pixel to the left of it, a,
    * and two pixels from the previous row, b and c:
    *   prev: c b
    *   row:  a d
    * The Paeth function predicts d to be whichever of a, b, or c is nearest to
    * p=a+b-c.
    *
    * The first pixel has no left context, and so uses an Up filter, p = b.
    * This works naturally with our main loop's p = a+b-c if we force a and c
    * to zero.
    * Here we zero b and d, which become c and a respectively at the start of
    * the loop.
    */
   size_t rb;
   const __m128i zero = _mm_setzero_si128();
   __m128i c, b = zero,
           a, d = zero;

   png_debug(1, "in png_read_filter_row_paeth3_sse2");

   rb = row_info->rowbytes;
   while (rb >= 4) {
      /* It's easiest to do this math (particularly, deal with pc) with 16-bit
       * intermediates.
       */
      __m128i pa,pb,pc,smallest,nearest;
      c = b; b = _mm_unpacklo_epi8(load4(prev), zero);
      a = d; d = _mm_unpacklo_epi8(load4(row ), zero);

      /* (p-a) == (a+b-c - a) == (b-c) */
   
      pa = _mm_sub_epi16(b,c);

      /* (p-b) == (a+b-c - b) == (a-c) */
      pb = _mm_sub_epi16(a,c);

      /* (p-c) == (a+b-c - c) == (a+b-c-c) == (b-c)+(a-c) */
      pc = _mm_add_epi16(pa,pb);

      pa = abs_i16(pa);  /* |p-a| */
      pb = abs_i16(pb);  /* |p-b| */
      pc = abs_i16(pc);  /* |p-c| */

      smallest = _mm_min_epi16(pc, _mm_min_epi16(pa, pb));

      /* Paeth breaks ties favoring a over b over c. */
      nearest  = if_then_else(_mm_cmpeq_epi16(smallest, pa), a,
                 if_then_else(_mm_cmpeq_epi16(smallest, pb), b,
                                                             c));

      /* Note `_epi8`: we need addition to wrap modulo 255. */
      d = _mm_add_epi8(d, nearest);
      store3(row, _mm_packus_epi16(d,d));

      prev += 3;
      row  += 3;
      rb   -= 3;
   }
   if (rb > 0) {
      /* It's easiest to do this math (particularly, deal with pc) with 16-bit
       * intermediates.
       */
      __m128i pa,pb,pc,smallest,nearest;
      c = b; b = _mm_unpacklo_epi8(load3(prev), zero);
      a = d; d = _mm_unpacklo_epi8(load3(row ), zero);

      /* (p-a) == (a+b-c - a) == (b-c) */
      pa = _mm_sub_epi16(b,c);

      /* (p-b) == (a+b-c - b) == (a-c) */
      pb = _mm_sub_epi16(a,c);

      /* (p-c) == (a+b-c - c) == (a+b-c-c) == (b-c)+(a-c) */
      pc = _mm_add_epi16(pa,pb);

      pa = abs_i16(pa);  /* |p-a| */
      pb = abs_i16(pb);  /* |p-b| */
      pc = abs_i16(pc);  /* |p-c| */

      smallest = _mm_min_epi16(pc, _mm_min_epi16(pa, pb));

      /* Paeth breaks ties favoring a over b over c. */
      nearest  = if_then_else(_mm_cmpeq_epi16(smallest, pa), a,
                         if_then_else(_mm_cmpeq_epi16(smallest, pb), b,
                                                                     c));

      /* Note `_epi8`: we need addition to wrap modulo 255. */
      d = _mm_add_epi8(d, nearest);
      store3(row, _mm_packus_epi16(d,d));

      prev += 3;
      row  += 3;
      rb   -= 3;
   }
}